

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_pbio.c
# Opt level: O0

void * CMpbio_get_format_rep_callback
                 (void *format_ID,int format_ID_length,int host_IP,int host_port,void *app_context,
                 void *client_data)

{
  atom_t aVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  __pid_t _Var5;
  char *pcVar6;
  long lVar7;
  pthread_t pVar8;
  uint in_ECX;
  in_addr_t in_EDX;
  undefined8 in_RDI;
  CMConnection in_R8;
  CManager in_R9;
  timespec ts_9;
  timespec ts_8;
  timespec ts_7;
  timespec ts_6;
  timespec ts_5;
  timespec ts_4;
  timespec ts_3;
  timespec ts_2;
  timespec ts_1;
  timespec ts;
  attr_list contact_attrs;
  int cond;
  char *host_string;
  in_addr in;
  char *server_rep;
  CMConnection conn;
  CManager cm;
  undefined8 in_stack_fffffffffffffe48;
  void *in_stack_fffffffffffffe50;
  CManager in_stack_fffffffffffffe58;
  FILE *pFVar9;
  CManager in_stack_fffffffffffffe60;
  FILE *in_stack_fffffffffffffe68;
  CManager in_stack_fffffffffffffe70;
  CManager in_stack_fffffffffffffe78;
  CManager in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  CMTraceType trace_type;
  CManager in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffeb0;
  int cond_00;
  CMConnection in_stack_fffffffffffffeb8;
  undefined8 in_stack_fffffffffffffec0;
  attr_list in_stack_fffffffffffffec8;
  FILE *in_stack_fffffffffffffee8;
  CManager_conflict in_stack_fffffffffffffef0;
  timespec local_108;
  timespec local_f8;
  timespec local_e8;
  timespec local_d8;
  timespec local_c8;
  timespec local_b8;
  timespec local_a8;
  timespec local_98;
  timespec local_88;
  timespec local_78;
  attr_list local_68;
  uint local_5c;
  char *local_58;
  in_addr_t local_4c;
  void *local_48;
  CMConnection local_40;
  CManager local_38;
  uint local_1c;
  in_addr local_18;
  undefined8 local_10;
  void *local_8;
  
  trace_type = (CMTraceType)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  cond_00 = (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20);
  iVar4 = (int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
  local_40 = in_R8;
  local_38 = in_R9;
  local_1c = in_ECX;
  local_18.s_addr = in_EDX;
  local_10 = in_RDI;
  local_68 = CMint_create_attr_list
                       (in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
                        (int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  iVar2 = CManager_locked(local_38);
  if (iVar2 == 0) {
    __assert_fail("CManager_locked(cm)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm_pbio.c"
                  ,0xfe,
                  "void *CMpbio_get_format_rep_callback(void *, int, int, int, void *, void *)");
  }
  local_4c = local_18.s_addr;
  local_58 = inet_ntoa(local_18);
  iVar2 = CMtrace_val[6];
  if (local_38->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(in_stack_fffffffffffffe90,trace_type);
  }
  if (iVar2 != 0) {
    if (CMtrace_PID != 0) {
      in_stack_fffffffffffffee8 = (FILE *)local_38->CMTrace_file;
      _Var5 = getpid();
      in_stack_fffffffffffffef0 = (CManager_conflict)(long)_Var5;
      pVar8 = pthread_self();
      fprintf(in_stack_fffffffffffffee8,"P%lxT%lx - ",in_stack_fffffffffffffef0,pVar8);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_78);
      fprintf((FILE *)local_38->CMTrace_file,"%lld.%.9ld - ",local_78.tv_sec,local_78.tv_nsec);
    }
    fprintf((FILE *)local_38->CMTrace_file,"CMpbio request for format from host %x, port %d\n",
            (ulong)local_18.s_addr,(ulong)local_1c);
  }
  fflush((FILE *)local_38->CMTrace_file);
  iVar2 = CMtrace_val[6];
  if (local_38->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(in_stack_fffffffffffffe90,trace_type);
  }
  if (iVar2 != 0) {
    fprintf((FILE *)local_38->CMTrace_file,"CMpbio request is for format ");
    fprint_server_ID(local_38->CMTrace_file,local_10);
    fprintf((FILE *)local_38->CMTrace_file,"\n");
  }
  local_5c = INT_CMCondition_get(in_stack_fffffffffffffe60,(CMConnection)in_stack_fffffffffffffe58);
  INT_CMCondition_set_client_data
            (in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
             in_stack_fffffffffffffe50);
  iVar2 = request_in_pending(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                             (int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
  iVar3 = (int)((ulong)in_stack_fffffffffffffe50 >> 0x20);
  if (iVar2 == -1) {
    add_request_to_pending
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,iVar3,
               (int)in_stack_fffffffffffffe50);
    iVar2 = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
    if ((local_40 == (CMConnection)0x0) || (local_40->closed != 0)) {
      iVar3 = CMtrace_val[6];
      if (local_38->CMTrace_file == (FILE *)0x0) {
        iVar3 = CMtrace_init(in_stack_fffffffffffffe90,trace_type);
      }
      if (iVar3 != 0) {
        if (CMtrace_PID != 0) {
          pFVar9 = (FILE *)local_38->CMTrace_file;
          _Var5 = getpid();
          pVar8 = pthread_self();
          fprintf(pFVar9,"P%lxT%lx - ",(long)_Var5,pVar8);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_88);
          fprintf((FILE *)local_38->CMTrace_file,"%lld.%.9ld - ",local_88.tv_sec,local_88.tv_nsec);
        }
        fprintf((FILE *)local_38->CMTrace_file,
                "CMpbio connection not available, trying to reestablish, conn %p, host %s, port %d\n"
                ,local_40,local_58,(ulong)local_1c);
      }
      fflush((FILE *)local_38->CMTrace_file);
      if (CMpbio_get_format_rep_callback::CM_IP_HOSTNAME == -1) {
        CMpbio_get_format_rep_callback::CM_IP_HOSTNAME = attr_atom_from_string("IP_HOST");
        CMpbio_get_format_rep_callback::CM_IP_PORT = attr_atom_from_string("IP_PORT");
      }
      aVar1 = CMpbio_get_format_rep_callback::CM_IP_HOSTNAME;
      in_stack_fffffffffffffec8 = local_68;
      pcVar6 = strdup(local_58);
      set_string_attr(in_stack_fffffffffffffec8,aVar1,pcVar6);
      set_int_attr(local_68,CMpbio_get_format_rep_callback::CM_IP_PORT,local_1c);
      local_40 = CMinternal_get_conn(in_stack_fffffffffffffef0,(attr_list)in_stack_fffffffffffffee8)
      ;
      if (local_40 == (CMConnection)0x0) {
        iVar4 = CMtrace_val[6];
        if (local_38->CMTrace_file == (FILE *)0x0) {
          iVar4 = CMtrace_init(in_stack_fffffffffffffe90,trace_type);
        }
        if (iVar4 != 0) {
          if (CMtrace_PID != 0) {
            pFVar9 = (FILE *)local_38->CMTrace_file;
            _Var5 = getpid();
            lVar7 = (long)_Var5;
            pVar8 = pthread_self();
            fprintf(pFVar9,"P%lxT%lx - ",lVar7,pVar8);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_98);
            fprintf((FILE *)local_38->CMTrace_file,"%lld.%.9ld - ",local_98.tv_sec,local_98.tv_nsec)
            ;
          }
          fprintf((FILE *)local_38->CMTrace_file,
                  "CMpbio failed to reestablish connection, returning NULL\n");
        }
        fflush((FILE *)local_38->CMTrace_file);
        return (void *)0x0;
      }
      iVar3 = CMtrace_val[6];
      if (local_38->CMTrace_file == (FILE *)0x0) {
        iVar3 = CMtrace_init(in_stack_fffffffffffffe90,trace_type);
      }
      if (iVar3 != 0) {
        if (CMtrace_PID != 0) {
          pFVar9 = (FILE *)local_38->CMTrace_file;
          _Var5 = getpid();
          lVar7 = (long)_Var5;
          pVar8 = pthread_self();
          fprintf(pFVar9,"P%lxT%lx - ",lVar7,pVar8);
          cond_00 = (int)((ulong)lVar7 >> 0x20);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_a8);
          fprintf((FILE *)local_38->CMTrace_file,"%lld.%.9ld - ",local_a8.tv_sec,local_a8.tv_nsec);
        }
        fprintf((FILE *)local_38->CMTrace_file,"CMpbio got connection %p\n",local_40);
      }
      fflush((FILE *)local_38->CMTrace_file);
    }
    else {
      local_40->conn_ref_count = local_40->conn_ref_count + 1;
      iVar3 = CMtrace_val[6];
      if (local_38->CMTrace_file == (FILE *)0x0) {
        iVar3 = CMtrace_init(in_stack_fffffffffffffe90,trace_type);
      }
      if (iVar3 != 0) {
        if (CMtrace_PID != 0) {
          pFVar9 = (FILE *)local_38->CMTrace_file;
          _Var5 = getpid();
          pVar8 = pthread_self();
          fprintf(pFVar9,"P%lxT%lx - ",(long)_Var5,pVar8);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_b8);
          fprintf((FILE *)local_38->CMTrace_file,"%lld.%.9ld - ",local_b8.tv_sec,local_b8.tv_nsec);
        }
        fprintf((FILE *)local_38->CMTrace_file,"CMpbio Request format on connection %p\n",local_40);
      }
      fflush((FILE *)local_38->CMTrace_file);
    }
    iVar4 = CMpbio_send_format_request
                      ((char *)in_stack_fffffffffffffec8,iVar4,in_stack_fffffffffffffeb8,cond_00);
    if (iVar4 != 1) {
      iVar4 = CMtrace_val[6];
      if (local_38->CMTrace_file == (FILE *)0x0) {
        iVar4 = CMtrace_init(in_stack_fffffffffffffe90,trace_type);
      }
      if (iVar4 != 0) {
        if (CMtrace_PID != 0) {
          pFVar9 = (FILE *)local_38->CMTrace_file;
          _Var5 = getpid();
          lVar7 = (long)_Var5;
          pVar8 = pthread_self();
          fprintf(pFVar9,"P%lxT%lx - ",lVar7,pVar8);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_c8);
          fprintf((FILE *)local_38->CMTrace_file,"%lld.%.9ld - ",local_c8.tv_sec,local_c8.tv_nsec);
        }
        fprintf((FILE *)local_38->CMTrace_file,"CMpbio write failed\n");
      }
      fflush((FILE *)local_38->CMTrace_file);
      return (void *)0x0;
    }
  }
  else {
    add_request_to_pending
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,iVar3,
               (int)in_stack_fffffffffffffe50);
    iVar2 = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
    iVar4 = CMtrace_val[6];
    if (local_38->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(in_stack_fffffffffffffe90,trace_type);
    }
    if (iVar4 != 0) {
      if (CMtrace_PID != 0) {
        in_stack_fffffffffffffe78 = (CManager)local_38->CMTrace_file;
        _Var5 = getpid();
        lVar7 = (long)_Var5;
        pVar8 = pthread_self();
        fprintf((FILE *)in_stack_fffffffffffffe78,"P%lxT%lx - ",lVar7,pVar8);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_d8);
        fprintf((FILE *)local_38->CMTrace_file,"%lld.%.9ld - ",local_d8.tv_sec,local_d8.tv_nsec);
      }
      fprintf((FILE *)local_38->CMTrace_file,"CMpbio - add duplicate pending request\n");
    }
    fflush((FILE *)local_38->CMTrace_file);
  }
  iVar4 = CMtrace_val[6];
  if (local_38->CMTrace_file == (FILE *)0x0) {
    iVar4 = CMtrace_init(in_stack_fffffffffffffe90,trace_type);
  }
  if (iVar4 != 0) {
    if (CMtrace_PID != 0) {
      in_stack_fffffffffffffe68 = (FILE *)local_38->CMTrace_file;
      _Var5 = getpid();
      in_stack_fffffffffffffe70 = (CManager)(long)_Var5;
      pVar8 = pthread_self();
      fprintf(in_stack_fffffffffffffe68,"P%lxT%lx - ",in_stack_fffffffffffffe70,pVar8);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_e8);
      fprintf((FILE *)local_38->CMTrace_file,"%lld.%.9ld - ",local_e8.tv_sec,local_e8.tv_nsec);
    }
    fprintf((FILE *)local_38->CMTrace_file,"CMpbio waiting on condition %d\n",(ulong)local_5c);
  }
  fflush((FILE *)local_38->CMTrace_file);
  IntCManager_unlock(in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,iVar2);
  iVar4 = INT_CMCondition_wait
                    (in_stack_fffffffffffffe78,(int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  if (iVar4 == 1) {
    iVar4 = CMtrace_val[6];
    if (local_38->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(in_stack_fffffffffffffe90,trace_type);
    }
    if (iVar4 != 0) {
      if (CMtrace_PID != 0) {
        pFVar9 = (FILE *)local_38->CMTrace_file;
        _Var5 = getpid();
        lVar7 = (long)_Var5;
        pVar8 = pthread_self();
        fprintf(pFVar9,"P%lxT%lx - ",lVar7,pVar8);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_108);
        fprintf((FILE *)local_38->CMTrace_file,"%lld.%.9ld - ",local_108.tv_sec,local_108.tv_nsec);
      }
      fprintf((FILE *)local_38->CMTrace_file,"CMpbio Request returned\n");
    }
    fflush((FILE *)local_38->CMTrace_file);
    IntCManager_lock(in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,iVar2);
    local_8 = local_48;
  }
  else {
    iVar4 = CMtrace_val[6];
    if (local_38->CMTrace_file == (FILE *)0x0) {
      iVar4 = CMtrace_init(in_stack_fffffffffffffe90,trace_type);
    }
    if (iVar4 != 0) {
      if (CMtrace_PID != 0) {
        pFVar9 = (FILE *)local_38->CMTrace_file;
        _Var5 = getpid();
        lVar7 = (long)_Var5;
        pVar8 = pthread_self();
        fprintf(pFVar9,"P%lxT%lx - ",lVar7,pVar8);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_f8);
        fprintf((FILE *)local_38->CMTrace_file,"%lld.%.9ld - ",local_f8.tv_sec,local_f8.tv_nsec);
      }
      fprintf((FILE *)local_38->CMTrace_file,"CMpbio Connection failed %p\n",local_40);
    }
    fflush((FILE *)local_38->CMTrace_file);
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

extern void *
CMpbio_get_format_rep_callback(void *format_ID, int format_ID_length, 
			       int host_IP, int host_port, void *app_context,
			       void *client_data)
{
    CManager cm = (CManager) client_data;
    CMConnection conn = (CMConnection) app_context;
    char *server_rep;
    struct in_addr in;
    char *host_string;
    int cond;
    attr_list contact_attrs = CMcreate_attr_list(cm);

    assert(CManager_locked(cm));

    in.s_addr = host_IP;
    host_string =  inet_ntoa(in);
    CMtrace_out(cm, CMFormatVerbose, "CMpbio request for format from host %x, port %d\n", host_IP, host_port);
#ifndef MODULE
    if (CMtrace_on(cm, CMFormatVerbose)) {
	fprintf(cm->CMTrace_file, "CMpbio request is for format ");
	fprint_server_ID(cm->CMTrace_file, format_ID);
	fprintf(cm->CMTrace_file, "\n");
    }
#endif

    cond = INT_CMCondition_get(cm, conn);
    INT_CMCondition_set_client_data(cm, cond, &server_rep);

    if (request_in_pending(cm, format_ID, format_ID_length) == -1) {
        add_request_to_pending(cm, format_ID, format_ID_length, cond);
	if ((conn == NULL) || (conn->closed)) {
	    static atom_t CM_IP_HOSTNAME = -1;
	    static atom_t CM_IP_PORT = -1;
	    CMtrace_out(cm, CMFormatVerbose, 
			"CMpbio connection not available, trying to reestablish, conn %p, host %s, port %d\n", 
			conn, host_string, host_port);
	    if (CM_IP_HOSTNAME == -1) {
		CM_IP_HOSTNAME = attr_atom_from_string("IP_HOST");
		CM_IP_PORT = attr_atom_from_string("IP_PORT");
	    }
	    set_string_attr(contact_attrs, CM_IP_HOSTNAME, 
			    strdup(host_string));
	    set_int_attr(contact_attrs, CM_IP_PORT, host_port);
	    
	    conn = CMinternal_get_conn(cm, contact_attrs);
	
	    if (conn == NULL) {
		CMtrace_out(cm, CMFormatVerbose, "CMpbio failed to reestablish connection, returning NULL\n");
		return NULL;
	    }
	    CMtrace_out(cm, CMFormatVerbose, "CMpbio got connection %p\n", 
			conn);
	} else {
	    conn->conn_ref_count++;
	    CMtrace_out(cm, CMFormatVerbose, "CMpbio Request format on connection %p\n",
			conn);
	}
	if (CMpbio_send_format_request(format_ID, format_ID_length, conn,
				       cond) != 1) {
	    CMtrace_out(cm, CMFormatVerbose, "CMpbio write failed\n");
	    return NULL;
	}
    } else {
        add_request_to_pending(cm, format_ID, format_ID_length, cond);
	CMtrace_out(cm, CMFormatVerbose, 
		    "CMpbio - add duplicate pending request\n");
    }
    CMtrace_out(cm, CMFormatVerbose, "CMpbio waiting on condition %d\n", cond);
    CManager_unlock(cm);
    if (INT_CMCondition_wait(cm, cond) != 1) {
	CMtrace_out(cm, CMFormatVerbose, "CMpbio Connection failed %p\n",
		    conn);
	return NULL;
    } else {
	CMtrace_out(cm, CMFormatVerbose, "CMpbio Request returned\n");
    }
    CManager_lock(cm);
    return server_rep;
}